

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall adios2::transport::FileFStream::CheckFile(FileFStream *this,string *hint)

{
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  string local_28;
  
  if (((&this->field_0x110)[*(long *)(*(long *)&this->m_FileStream + -0x18)] & 5) != 0) {
    std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_69);
    std::__cxx11::string::string((string *)&local_48,"transport::file::FileFStream",&local_6a);
    std::__cxx11::string::string((string *)&local_68,"CheckFile",&local_6b);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_28,&local_48,&local_68,hint,-1);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void FileFStream::CheckFile(const std::string hint) const
{
    if (!m_FileStream)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileFStream",
                                              "CheckFile", hint);
    }
}